

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O2

set_value set_remove(set s,set_key key)

{
  int iVar1;
  hash hVar2;
  undefined8 uVar3;
  char *pcVar4;
  set_value value;
  
  value = (set_value)0x0;
  if (s == (set)0x0 || key == (set_key)0x0) {
    pcVar4 = "Invalid set remove parameters";
    uVar3 = 0x16d;
  }
  else {
    hVar2 = (*s->hash_cb)(key);
    iVar1 = bucket_remove(s->buckets + hVar2 % s->capacity,s->compare_cb,key,&value);
    if (iVar1 == 0) {
      s->count = s->count - 1;
      iVar1 = set_bucket_realloc(s);
      if (iVar1 == 0) {
        return value;
      }
      pcVar4 = "Invalid set bucket remove reallocation";
      uVar3 = 0x181;
    }
    else {
      pcVar4 = "Invalid set bucket remove: %p";
      uVar3 = 0x179;
    }
  }
  log_write_impl_va("metacall",uVar3,"set_remove",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                    ,3,pcVar4);
  return (set_value)0x0;
}

Assistant:

set_value set_remove(set s, set_key key)
{
	set_hash h;
	size_t index;
	bucket b;
	set_value value = NULL;

	if (s == NULL || key == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid set remove parameters");
		return NULL;
	}

	h = s->hash_cb(key);

	index = h % s->capacity;

	b = &s->buckets[index];

	if (bucket_remove(b, s->compare_cb, key, &value) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid set bucket remove: %p", key);
		return NULL;
	}

	--s->count;

	if (set_bucket_realloc(s) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid set bucket remove reallocation");
		return NULL;
	}

	return value;
}